

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  LogMessage *pLVar1;
  Type *pTVar2;
  ulong uVar3;
  LogFinisher local_e1;
  ulong local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5b5);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5b6);
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if ((this->super_RepeatedPtrFieldBase).current_size_ < num + start) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5b7);
    pLVar1 = internal::LogMessage::operator<<(&local_d8,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_e1,pLVar1);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  if (0 < num) {
    local_e0 = (ulong)(uint)start;
    if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
      uVar3 = 0;
      do {
        pTVar2 = internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,(int)uVar3 + start);
        elements[uVar3] = pTVar2;
        uVar3 = uVar3 + 1;
      } while ((uint)num != uVar3);
    }
    internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,(int)local_e0,num);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      for (int i = 0; i < num; ++i) {
        elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
      }
    }
    CloseGap(start, num);
  }
}